

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermediateParser.cpp
# Opt level: O0

unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __thiscall
cs222::IntermediateParser::next(IntermediateParser *this)

{
  string *this_00;
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  istream *piVar4;
  ulong uVar5;
  char *pcVar6;
  unsigned_long addr;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  difference_type dVar8;
  const_reference this_01;
  pointer pvVar9;
  type pIVar10;
  Parser *in_RSI;
  bool local_52a;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
  local_4c8;
  Format local_4bc;
  undefined1 local_4b8 [4];
  Format fmt_1;
  Operand_pair temp;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_448;
  undefined1 local_428 [8];
  smatch match;
  size_t first_non_space;
  undefined1 local_3a0 [16];
  streamoff local_390;
  size_t lookahead_start;
  string lookahead;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
  local_360;
  Format local_354;
  Format fmt;
  Operand local_348;
  Operand local_320;
  undefined1 local_2f2;
  byte local_2f1;
  string local_2f0;
  bitset<6UL> local_2d0;
  string comment;
  Operand_pair operands;
  string operandsToken;
  string operation;
  string label;
  size_t address;
  undefined1 local_1f0 [8];
  string token;
  stringstream sstream;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  IntermediateParser *this_local;
  unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *ptr;
  
  this_local = this;
  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (in_RSI->inputStream,(string *)&in_RSI->line);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
  if (!bVar1) {
    std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
    unique_ptr<std::default_delete<cs222::Instruction>,void>
              ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  in_RSI->lineNumber = in_RSI->lineNumber + 1;
  std::bitset<6UL>::reset(&in_RSI->flags);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_38,"^\\s*$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&in_RSI->line,&local_38,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_38);
  if (bVar1) {
    std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
    unique_ptr<std::default_delete<cs222::Instruction>,void>
              ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  uVar5 = std::ios::operator!((ios *)(in_RSI->inputStream +
                                     *(long *)(*(long *)in_RSI->inputStream + -0x18)));
  if ((uVar5 & 1) != 0) {
    std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
    unique_ptr<std::default_delete<cs222::Instruction>,void>
              ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(token.field_2._M_local_buf + 8),(string *)&in_RSI->line,_Var2);
  std::__cxx11::string::string((string *)local_1f0);
  Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
  Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
  if (*pcVar6 == '.') {
    (**in_RSI->_vptr_Parser)(this);
    goto LAB_0015ce5c;
  }
  addr = std::__cxx11::stoul((string *)local_1f0,(size_t *)0x0,0x10);
  Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
  std::__cxx11::string::string((string *)(operation.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(operandsToken.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(operands.second.value.field_2._M_local_buf + 8));
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
            ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8));
  std::__cxx11::string::string((string *)&local_2d0);
  local_2f1 = 0;
  bVar1 = isDirective((string *)local_1f0);
  local_52a = true;
  if (!bVar1) {
    bVar1 = isOperation((string *)local_1f0);
    local_52a = true;
    if (!bVar1) {
      std::__cxx11::string::substr((ulong)&local_2f0,(ulong)local_1f0);
      local_2f1 = 1;
      local_52a = isOperation(&local_2f0);
    }
  }
  if ((local_2f1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  if (((local_52a ^ 0xffU) & 1) == 0) {
LAB_0015c5f0:
    Parser::parseOperation(in_RSI,(string *)local_1f0,(string *)((long)&operandsToken.field_2 + 8));
    bVar1 = isOperation((string *)((long)&operandsToken.field_2 + 8));
    if (bVar1) {
      local_360._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
                   *)OpTable_abi_cxx11_,(key_type *)((long)&operandsToken.field_2 + 8));
      pvVar9 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                             *)&local_360);
      local_354 = Operation::getValidFormat(&pvVar9->second);
      if ((local_354 == FORMAT_1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&operandsToken.field_2 + 8),"RSUB"), bVar1)) {
        Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
        std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_1f0);
        Parser::flushRestToToken
                  ((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
        std::__cxx11::string::operator+=((string *)&local_2d0,(string *)local_1f0);
        lookahead.field_2._M_local_buf[0xf] = '\0';
        std::
        make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
                  ((unsigned_long *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &in_RSI->lineNumber,&in_RSI->line,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&operation.field_2 + 8),(Operand *)((long)&operandsToken.field_2 + 8),
                   (Operand *)((long)&comment.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&operands.first.value.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&operands.second.value.field_2 + 8),&local_2d0);
        pIVar10 = std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::
                  operator*((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>
                             *)this);
        Instruction::setAddress(pIVar10,addr);
        lookahead.field_2._M_local_buf[0xf] = '\x01';
        goto LAB_0015cde0;
      }
    }
    std::__cxx11::string::string((string *)&lookahead_start);
    local_3a0 = std::istream::tellg();
    local_390 = std::fpos::operator_cast_to_long((fpos *)local_3a0);
    if (local_390 != -1) {
      std::__cxx11::string::substr((ulong)&first_non_space,(ulong)&in_RSI->line);
      std::__cxx11::string::operator=((string *)&lookahead_start,(string *)&first_non_space);
      std::__cxx11::string::~string((string *)&first_non_space);
    }
    __first._M_current = (char *)std::__cxx11::string::begin();
    _Var7._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    _Var7 = std::find_if_not<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                      (_Var7,__last,isspace);
    dVar8 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,_Var7);
    std::__cxx11::string::substr((ulong)&match._M_begin,(ulong)&lookahead_start);
    std::__cxx11::string::operator=((string *)&lookahead_start,(string *)&match._M_begin);
    std::__cxx11::string::~string((string *)&match._M_begin);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_428);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_448,"^\\=?C\'[A-Za-z0-9\\s]+\'",0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &lookahead_start,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_428,&local_448,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_448);
    if (bVar1) {
      this_01 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_428,0);
      std::__cxx11::sub_match::operator_cast_to_string
                ((string_type *)((long)&temp.second.value.field_2 + 8),(sub_match *)this_01);
      this_00 = (string *)(temp.second.value.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)local_1f0,this_00);
      std::__cxx11::string::~string(this_00);
      iVar3 = std::__cxx11::string::length();
      std::istream::seekg((long)((long)&token.field_2 + 8),(int)dVar8 + iVar3);
    }
    else {
      Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    }
    std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
              ((pair<cs222::Operand,_cs222::Operand> *)local_4b8);
    bVar1 = Parser::parseOperands(in_RSI,(string *)local_1f0,(Operand_pair *)local_4b8);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(operands.second.value.field_2._M_local_buf + 8),(string *)local_1f0);
      std::pair<cs222::Operand,_cs222::Operand>::operator=
                ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8),
                 (type)local_4b8);
      bVar1 = isOperation((string *)((long)&operandsToken.field_2 + 8));
      if (bVar1) {
        local_4c8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
                     *)OpTable_abi_cxx11_,(key_type *)((long)&operandsToken.field_2 + 8));
        pvVar9 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                               *)&local_4c8);
        local_4bc = Operation::getValidFormat(&pvVar9->second);
        if (local_4bc == FORMAT_3_4) {
          bVar1 = std::bitset<6UL>::test(&in_RSI->flags,5);
          if (!bVar1) {
            bVar1 = std::bitset<6UL>::test(&in_RSI->flags,4);
            if (!bVar1) {
              std::bitset<6UL>::set(&in_RSI->flags,5,true);
              std::bitset<6UL>::set(&in_RSI->flags,4,true);
            }
          }
        }
      }
      Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    }
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_1f0);
    Parser::flushRestToToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    std::__cxx11::string::operator+=((string *)&local_2d0,(string *)local_1f0);
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RSI->lineNumber,&in_RSI->line,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operation.field_2 + 8),(Operand *)((long)&operandsToken.field_2 + 8),
               (Operand *)((long)&comment.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.first.value.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.second.value.field_2 + 8),&local_2d0);
    pIVar10 = std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::
              operator*((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
                        this);
    Instruction::setAddress(pIVar10,addr);
    std::pair<cs222::Operand,_cs222::Operand>::~pair
              ((pair<cs222::Operand,_cs222::Operand> *)local_4b8);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_428);
    std::__cxx11::string::~string((string *)&lookahead_start);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f0,"*");
    if (!bVar1) {
      Parser::parseLabel(in_RSI,(string *)local_1f0,(string *)((long)&operation.field_2 + 8));
      Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
      goto LAB_0015c5f0;
    }
    std::__cxx11::string::operator=
              ((string *)(operation.field_2._M_local_buf + 8),(string *)local_1f0);
    Parser::advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    std::__cxx11::string::operator=
              ((string *)(operandsToken.field_2._M_local_buf + 8),(string *)local_1f0);
    local_2f2 = 0;
    Operand::Operand(&local_320);
    Operand::Operand(&local_348);
    std::bitset<6UL>::bitset((bitset<6UL> *)&stack0xfffffffffffffcb0);
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand,cs222::Operand,char_const(&)[1],char_const(&)[1],std::bitset<6ul>>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RSI->lineNumber,&in_RSI->line,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operation.field_2 + 8),(Operand *)((long)&operandsToken.field_2 + 8),
               &local_320,(char (*) [1])&local_348,(char (*) [1])0x15e7e3,(bitset<6UL> *)0x15e7e3);
    Operand::~Operand(&local_348);
    Operand::~Operand(&local_320);
    pIVar10 = std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::
              operator*((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
                        this);
    Instruction::setAddress(pIVar10,addr);
    local_2f2 = 1;
  }
LAB_0015cde0:
  std::__cxx11::string::~string((string *)&local_2d0);
  std::pair<cs222::Operand,_cs222::Operand>::~pair
            ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8));
  std::__cxx11::string::~string((string *)(operands.second.value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(operandsToken.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(operation.field_2._M_local_buf + 8));
LAB_0015ce5c:
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Instruction> IntermediateParser::next() {

        if (std::getline(inputStream, line))
        {
            lineNumber += 1;
            flags.reset();

            // Stop on empty line
            if (std::regex_match(line, std::regex("^\\s*$")))
                return nullptr;
            // Reached end of stream?
            if (!inputStream)
            {
                return nullptr;
            }

            std::stringstream sstream(line);
            std::string token;

            advanceToken(sstream, token);// Skipping line number.

            advanceToken(sstream, token);// Expecting address.

            if (token[0] == '.') {// Skip comment lines.
                return this->next();
            }

            std::size_t address;
            address = std::stoul(token, nullptr, 16);

            advanceToken(sstream, token);

            std::string label;
            std::string operation;
            std::string operandsToken;
            Operand_pair operands;
            std::string comment;

            if (!(
                    isDirective(token) ||
                    isOperation(token) ||
                    isOperation(token.substr(1))))
            {
                if (token == "*") { // Literal found.
                    label = token;
                    advanceToken(sstream, token);
                    operation = token;
                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            Operand(), Operand(), "", "", std::bitset<6>());

                    (*ptr).setAddress(address);

                    return ptr;
                } else {
                    parseLabel(token, label);
                    advanceToken(sstream, token);
                }
            }

            parseOperation(token, operation);

            if (isOperation(operation))
            {
                Instruction::Format fmt =
                        OpTable.find(operation)->second.getValidFormat();
                if (fmt == Instruction::FORMAT_1 || operation == "RSUB")
                {
                    advanceToken(sstream, token);
                    comment = token;
                    flushRestToToken(sstream, token);
                    comment += token;

                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            operands.first, operands.second,
                            operandsToken, comment, flags);

                    (*ptr).setAddress(address);

                    return ptr;
                }
            }

            // Corner case: character constants
            // and literals can have spaces
            std::string lookahead;
            size_t lookahead_start = sstream.tellg();
            if (lookahead_start != -1)
            {
                lookahead = line.substr(lookahead_start);
            }
            size_t first_non_space = std::distance(
                    lookahead.begin(),
                    find_if_not(lookahead.begin(), lookahead.end(), isspace));
            lookahead = lookahead.substr(first_non_space);
            std::smatch match;
            if (std::regex_match(
                    lookahead,
                    match,
                    std::regex("^\\=?C'[A-Za-z0-9\\s]+'")))
            {
                token = match[0];
                sstream.seekg(
                        first_non_space + token.length(), std::ios_base::cur);
            }
            else
            {
                advanceToken(sstream, token);
            }

            Operand_pair temp;
            if (parseOperands(token, temp))
            {
                operandsToken = token;
                operands = temp;
                // SIC/XE Simple Addressing
                if (isOperation(operation))
                {
                    Instruction::Format fmt =
                            cs222::OpTable.find(operation)->second.getValidFormat();
                    if (fmt == Instruction::FORMAT_3_4 && !(
                            flags.test(Instruction::FLAG_INDIRECT) ||
                            flags.test(Instruction::FLAG_IMMEDIATE)))
                    {
                        flags.set(Instruction::FLAG_INDIRECT);
                        flags.set(Instruction::FLAG_IMMEDIATE);
                    }
                }
                advanceToken(sstream, token);
            }

            comment = token;
            flushRestToToken(sstream, token);
            comment += token;

            std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                    lineNumber, line, label, operation,
                    operands.first, operands.second,
                    operandsToken, comment, flags);

            (*ptr).setAddress(address);

            return ptr;
        }

        return nullptr;
    }